

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestExpandNoLoad(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  bool bVar3;
  char cVar4;
  string out;
  TemplateString local_178;
  string top_filename;
  TemplateCache cache;
  TemplateDictionary dict;
  string inc_filename;
  string filename;
  uint7 uStack_37;
  TemplateString local_28;
  
  ctemplate::TemplateCache::TemplateCache(&cache);
  std::__cxx11::string::string((string *)&dict,"alone",(allocator *)&top_filename);
  ctemplate::StringToTemplateFile(&filename,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"Hello, {{>WORLD}}",(allocator *)&inc_filename);
  ctemplate::StringToTemplateFile(&top_filename,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"world",(allocator *)&out);
  ctemplate::StringToTemplateFile(&inc_filename,(string *)&dict);
  std::__cxx11::string::~string((string *)&dict);
  ctemplate::TemplateString::TemplateString((TemplateString *)&out,"ExpandNoLoad");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,(TemplateString *)&out,(UnsafeArena *)0x0)
  ;
  ctemplate::TemplateString::TemplateString(&local_28,"WORLD");
  TVar1.length_ = local_28.length_;
  TVar1.ptr_ = local_28.ptr_;
  TVar1.is_immutable_ = local_28.is_immutable_;
  TVar1._17_7_ = local_28._17_7_;
  TVar1.id_ = local_28.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  TVar2.length_ = inc_filename._M_string_length;
  TVar2.ptr_ = inc_filename._M_dataplus._M_p;
  TVar2._16_8_ = (ulong)uStack_37 << 8;
  TVar2.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  ctemplate::TemplateCache::Freeze();
  local_178.ptr_ = filename._M_dataplus._M_p;
  local_178.length_ = filename._M_string_length;
  local_178.is_immutable_ = false;
  local_178.id_ = 0;
  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                    (&cache,&local_178,DO_NOT_STRIP,(TemplateDictionaryInterface *)&dict,
                     (PerExpandData *)0x0,&out);
  if (bVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0xcc,
           "!cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out)");
    local_178.ptr_ = filename._M_dataplus._M_p;
    local_178.length_ = filename._M_string_length;
    local_178.is_immutable_ = false;
    local_178.id_ = 0;
    bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                      (&cache,&local_178,DO_NOT_STRIP,(TemplateDictionaryInterface *)&dict,
                       (PerExpandData *)0x0,&out);
    if (bVar3) {
      __assert_fail("!cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xcc,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
  }
  else {
    ctemplate::TemplateCache::ClearCache();
    local_178.ptr_ = filename._M_dataplus._M_p;
    local_178.length_ = filename._M_string_length;
    local_178.is_immutable_ = false;
    local_178.id_ = 0;
    bVar3 = ctemplate::TemplateCache::ExpandWithData
                      (&cache,&local_178,DO_NOT_STRIP,(TemplateDictionaryInterface *)&dict,
                       (PerExpandData *)0x0,&out);
    if (bVar3) {
      bVar3 = std::operator==(&out,"alone");
      if (bVar3) {
        out._M_string_length = 0;
        *out._M_dataplus._M_p = '\0';
        ctemplate::TemplateCache::Freeze();
        local_178.ptr_ = filename._M_dataplus._M_p;
        local_178.length_ = filename._M_string_length;
        local_178.is_immutable_ = false;
        local_178.id_ = 0;
        bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                          (&cache,&local_178,DO_NOT_STRIP,(TemplateDictionaryInterface *)&dict,
                           (PerExpandData *)0x0,&out);
        if (bVar3) {
          bVar3 = std::operator==(&out,"alone");
          if (bVar3) {
            out._M_string_length = 0;
            *out._M_dataplus._M_p = '\0';
            ctemplate::TemplateCache::ClearCache();
            ctemplate::TemplateCache::Freeze();
            local_178.ptr_ = top_filename._M_dataplus._M_p;
            local_178.length_ = top_filename._M_string_length;
            local_178.is_immutable_ = false;
            local_178.id_ = 0;
            bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                              (&cache,&local_178,DO_NOT_STRIP,(TemplateDictionaryInterface *)&dict,
                               (PerExpandData *)0x0,&out);
            if (bVar3) {
              printf("ASSERT FAILED, line %d: %s\n",0xdc,
                     "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
              local_178.ptr_ = top_filename._M_dataplus._M_p;
              local_178.length_ = top_filename._M_string_length;
              local_178.is_immutable_ = false;
              local_178.id_ = 0;
              bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                                (&cache,&local_178,DO_NOT_STRIP,(TemplateDictionaryInterface *)&dict
                                 ,(PerExpandData *)0x0,&out);
              if (bVar3) {
                __assert_fail("!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                              ,0xdc,"static void TemplateCacheUnittest::TestExpandNoLoad()");
              }
            }
            else {
              ctemplate::TemplateCache::ClearCache();
              local_178.ptr_ = top_filename._M_dataplus._M_p;
              local_178.length_ = top_filename._M_string_length;
              local_178.is_immutable_ = false;
              local_178.id_ = 0;
              cVar4 = ctemplate::TemplateCache::LoadTemplate
                                ((TemplateString *)&cache,(Strip)&local_178);
              if (cVar4 == '\0') {
                printf("ASSERT FAILED, line %d: %s\n",0xde,
                       "cache.LoadTemplate(top_filename, DO_NOT_STRIP)");
                local_178.ptr_ = top_filename._M_dataplus._M_p;
                local_178.length_ = top_filename._M_string_length;
                local_178.is_immutable_ = false;
                local_178.id_ = 0;
                cVar4 = ctemplate::TemplateCache::LoadTemplate
                                  ((TemplateString *)&cache,(Strip)&local_178);
                if (cVar4 == '\0') {
                  __assert_fail("cache.LoadTemplate(top_filename, DO_NOT_STRIP)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                ,0xde,"static void TemplateCacheUnittest::TestExpandNoLoad()");
                }
              }
              else {
                ctemplate::TemplateCache::Freeze();
                local_178.ptr_ = top_filename._M_dataplus._M_p;
                local_178.length_ = top_filename._M_string_length;
                local_178.is_immutable_ = false;
                local_178.id_ = 0;
                bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                                  (&cache,&local_178,DO_NOT_STRIP,
                                   (TemplateDictionaryInterface *)&dict,(PerExpandData *)0x0,&out);
                if (bVar3) {
                  printf("ASSERT FAILED, line %d: %s\n",0xe1,
                         "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
                  local_178.ptr_ = top_filename._M_dataplus._M_p;
                  local_178.length_ = top_filename._M_string_length;
                  local_178.is_immutable_ = false;
                  local_178.id_ = 0;
                  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                                    (&cache,&local_178,DO_NOT_STRIP,
                                     (TemplateDictionaryInterface *)&dict,(PerExpandData *)0x0,&out)
                  ;
                  if (bVar3) {
                    __assert_fail("!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                  ,0xe1,"static void TemplateCacheUnittest::TestExpandNoLoad()");
                  }
                }
                else {
                  out._M_string_length = 0;
                  *out._M_dataplus._M_p = '\0';
                  ctemplate::TemplateCache::ClearCache();
                  local_178.ptr_ = top_filename._M_dataplus._M_p;
                  local_178.length_ = top_filename._M_string_length;
                  local_178.is_immutable_ = false;
                  local_178.id_ = 0;
                  cVar4 = ctemplate::TemplateCache::LoadTemplate
                                    ((TemplateString *)&cache,(Strip)&local_178);
                  if (cVar4 == '\0') {
                    printf("ASSERT FAILED, line %d: %s\n",0xe6,
                           "cache.LoadTemplate(top_filename, DO_NOT_STRIP)");
                    local_178.ptr_ = top_filename._M_dataplus._M_p;
                    local_178.length_ = top_filename._M_string_length;
                    local_178.is_immutable_ = false;
                    local_178.id_ = 0;
                    cVar4 = ctemplate::TemplateCache::LoadTemplate
                                      ((TemplateString *)&cache,(Strip)&local_178);
                    if (cVar4 == '\0') {
                      __assert_fail("cache.LoadTemplate(top_filename, DO_NOT_STRIP)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                    ,0xe6,"static void TemplateCacheUnittest::TestExpandNoLoad()");
                    }
                  }
                  else {
                    local_178.ptr_ = inc_filename._M_dataplus._M_p;
                    local_178.length_ = inc_filename._M_string_length;
                    local_178.is_immutable_ = false;
                    local_178.id_ = 0;
                    cVar4 = ctemplate::TemplateCache::LoadTemplate
                                      ((TemplateString *)&cache,(Strip)&local_178);
                    if (cVar4 == '\0') {
                      printf("ASSERT FAILED, line %d: %s\n",0xe7,
                             "cache.LoadTemplate(inc_filename, DO_NOT_STRIP)");
                      local_178.ptr_ = inc_filename._M_dataplus._M_p;
                      local_178.length_ = inc_filename._M_string_length;
                      local_178.is_immutable_ = false;
                      local_178.id_ = 0;
                      cVar4 = ctemplate::TemplateCache::LoadTemplate
                                        ((TemplateString *)&cache,(Strip)&local_178);
                      if (cVar4 == '\0') {
                        __assert_fail("cache.LoadTemplate(inc_filename, DO_NOT_STRIP)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                      ,0xe7,"static void TemplateCacheUnittest::TestExpandNoLoad()")
                        ;
                      }
                    }
                    else {
                      ctemplate::TemplateCache::Freeze();
                      local_178.ptr_ = top_filename._M_dataplus._M_p;
                      local_178.length_ = top_filename._M_string_length;
                      local_178.is_immutable_ = false;
                      local_178.id_ = 0;
                      bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                                        (&cache,&local_178,DO_NOT_STRIP,
                                         (TemplateDictionaryInterface *)&dict,(PerExpandData *)0x0,
                                         &out);
                      if (bVar3) {
                        bVar3 = std::operator==(&out,"Hello, world");
                        if (bVar3) {
                          out._M_string_length = 0;
                          *out._M_dataplus._M_p = '\0';
                          local_178.ptr_ = top_filename._M_dataplus._M_p;
                          local_178.length_ = top_filename._M_string_length;
                          local_178.is_immutable_ = false;
                          local_178.id_ = 0;
                          bVar3 = ctemplate::TemplateCache::ExpandWithData
                                            (&cache,&local_178,DO_NOT_STRIP,
                                             (TemplateDictionaryInterface *)&dict,
                                             (PerExpandData *)0x0,&out);
                          if (bVar3) {
                            bVar3 = std::operator==(&out,"Hello, world");
                            if (bVar3) {
                              out._M_string_length = 0;
                              *out._M_dataplus._M_p = '\0';
                              ctemplate::TemplateCache::ClearCache();
                              local_178.ptr_ = top_filename._M_dataplus._M_p;
                              local_178.length_ = top_filename._M_string_length;
                              local_178.is_immutable_ = false;
                              local_178.id_ = 0;
                              bVar3 = ctemplate::TemplateCache::ExpandWithData
                                                (&cache,&local_178,DO_NOT_STRIP,
                                                 (TemplateDictionaryInterface *)&dict,
                                                 (PerExpandData *)0x0,&out);
                              if (bVar3) {
                                bVar3 = std::operator==(&out,"Hello, world");
                                if (bVar3) {
                                  out._M_string_length = 0;
                                  *out._M_dataplus._M_p = '\0';
                                  ctemplate::TemplateCache::Freeze();
                                  local_178.ptr_ = top_filename._M_dataplus._M_p;
                                  local_178.length_ = top_filename._M_string_length;
                                  local_178.is_immutable_ = false;
                                  local_178.id_ = 0;
                                  bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                                                    (&cache,&local_178,DO_NOT_STRIP,
                                                     (TemplateDictionaryInterface *)&dict,
                                                     (PerExpandData *)0x0,&out);
                                  if (bVar3) {
                                    bVar3 = std::operator==(&out,"Hello, world");
                                    if (bVar3) {
                                      out._M_string_length = 0;
                                      *out._M_dataplus._M_p = '\0';
                                      ctemplate::TemplateCache::ClearCache();
                                      local_178.ptr_ = top_filename._M_dataplus._M_p;
                                      local_178.length_ = top_filename._M_string_length;
                                      local_178.is_immutable_ = false;
                                      local_178.id_ = 0;
                                      cVar4 = ctemplate::TemplateCache::LoadTemplate
                                                        ((TemplateString *)&cache,(Strip)&local_178)
                                      ;
                                      if (cVar4 == '\0') {
                                        printf("ASSERT FAILED, line %d: %s\n",0xfd,
                                               "cache.LoadTemplate(top_filename, DO_NOT_STRIP)");
                                        local_178.ptr_ = top_filename._M_dataplus._M_p;
                                        local_178.length_ = top_filename._M_string_length;
                                        local_178.is_immutable_ = false;
                                        local_178.id_ = 0;
                                        cVar4 = ctemplate::TemplateCache::LoadTemplate
                                                          ((TemplateString *)&cache,
                                                           (Strip)&local_178);
                                        if (cVar4 == '\0') {
                                          __assert_fail(
                                                  "cache.LoadTemplate(top_filename, DO_NOT_STRIP)",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0xfd,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                        }
                                      }
                                      else {
                                        ctemplate::TemplateCache::Freeze();
                                        local_178.ptr_ = inc_filename._M_dataplus._M_p;
                                        local_178.length_ = inc_filename._M_string_length;
                                        local_178.is_immutable_ = false;
                                        local_178.id_ = 0;
                                        cVar4 = ctemplate::TemplateCache::LoadTemplate
                                                          ((TemplateString *)&cache,
                                                           (Strip)&local_178);
                                        if (cVar4 == '\0') {
                                          local_178.ptr_ = top_filename._M_dataplus._M_p;
                                          local_178.length_ = top_filename._M_string_length;
                                          local_178.is_immutable_ = false;
                                          local_178.id_ = 0;
                                          bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                                                            (&cache,&local_178,DO_NOT_STRIP,
                                                             (TemplateDictionaryInterface *)&dict,
                                                             (PerExpandData *)0x0,&out);
                                          if (!bVar3) {
                                            std::__cxx11::string::~string((string *)&out);
                                            ctemplate::TemplateDictionary::~TemplateDictionary
                                                      (&dict);
                                            std::__cxx11::string::~string((string *)&inc_filename);
                                            std::__cxx11::string::~string((string *)&top_filename);
                                            std::__cxx11::string::~string((string *)&filename);
                                            ctemplate::TemplateCache::~TemplateCache(&cache);
                                            return;
                                          }
                                          printf("ASSERT FAILED, line %d: %s\n",0x102,
                                                 "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)"
                                                );
                                          local_178.ptr_ = top_filename._M_dataplus._M_p;
                                          local_178.length_ = top_filename._M_string_length;
                                          local_178.is_immutable_ = false;
                                          local_178.id_ = 0;
                                          bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                                                            (&cache,&local_178,DO_NOT_STRIP,
                                                             (TemplateDictionaryInterface *)&dict,
                                                             (PerExpandData *)0x0,&out);
                                          if (bVar3) {
                                            __assert_fail(
                                                  "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x102,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                          }
                                        }
                                        else {
                                          printf("ASSERT FAILED, line %d: %s\n",0x100,
                                                 "!cache.LoadTemplate(inc_filename, DO_NOT_STRIP)");
                                          local_178.ptr_ = inc_filename._M_dataplus._M_p;
                                          local_178.length_ = inc_filename._M_string_length;
                                          local_178.is_immutable_ = false;
                                          local_178.id_ = 0;
                                          cVar4 = ctemplate::TemplateCache::LoadTemplate
                                                            ((TemplateString *)&cache,
                                                             (Strip)&local_178);
                                          if (cVar4 != '\0') {
                                            __assert_fail(
                                                  "!cache.LoadTemplate(inc_filename, DO_NOT_STRIP)",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x100,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      printf("ASSERT FAILED, line %d: %s\n",0xf9,
                                             "out == \"Hello, world\"");
                                      bVar3 = std::operator==(&out,"Hello, world");
                                      if (!bVar3) {
                                        __assert_fail("out == \"Hello, world\"",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0xf9,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                      }
                                    }
                                  }
                                  else {
                                    printf("ASSERT FAILED, line %d: %s\n",0xf8,
                                           "cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)"
                                          );
                                    local_178.ptr_ = top_filename._M_dataplus._M_p;
                                    local_178.length_ = top_filename._M_string_length;
                                    local_178.is_immutable_ = false;
                                    local_178.id_ = 0;
                                    bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                                                      (&cache,&local_178,DO_NOT_STRIP,
                                                       (TemplateDictionaryInterface *)&dict,
                                                       (PerExpandData *)0x0,&out);
                                    if (!bVar3) {
                                      __assert_fail(
                                                  "cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0xf8,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                    }
                                  }
                                }
                                else {
                                  printf("ASSERT FAILED, line %d: %s\n",0xf4,
                                         "out == \"Hello, world\"");
                                  bVar3 = std::operator==(&out,"Hello, world");
                                  if (!bVar3) {
                                    __assert_fail("out == \"Hello, world\"",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0xf4,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                 );
                                  }
                                }
                              }
                              else {
                                printf("ASSERT FAILED, line %d: %s\n",0xf3,
                                       "cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out)"
                                      );
                                local_178.ptr_ = top_filename._M_dataplus._M_p;
                                local_178.length_ = top_filename._M_string_length;
                                local_178.is_immutable_ = false;
                                local_178.id_ = 0;
                                bVar3 = ctemplate::TemplateCache::ExpandWithData
                                                  (&cache,&local_178,DO_NOT_STRIP,
                                                   (TemplateDictionaryInterface *)&dict,
                                                   (PerExpandData *)0x0,&out);
                                if (!bVar3) {
                                  __assert_fail("cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                ,0xf3,
                                                "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                               );
                                }
                              }
                            }
                            else {
                              printf("ASSERT FAILED, line %d: %s\n",0xef,"out == \"Hello, world\"");
                              bVar3 = std::operator==(&out,"Hello, world");
                              if (!bVar3) {
                                __assert_fail("out == \"Hello, world\"",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                              ,0xef,
                                              "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                             );
                              }
                            }
                          }
                          else {
                            printf("ASSERT FAILED, line %d: %s\n",0xee,
                                   "cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out)"
                                  );
                            local_178.ptr_ = top_filename._M_dataplus._M_p;
                            local_178.length_ = top_filename._M_string_length;
                            local_178.is_immutable_ = false;
                            local_178.id_ = 0;
                            bVar3 = ctemplate::TemplateCache::ExpandWithData
                                              (&cache,&local_178,DO_NOT_STRIP,
                                               (TemplateDictionaryInterface *)&dict,
                                               (PerExpandData *)0x0,&out);
                            if (!bVar3) {
                              __assert_fail("cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                            ,0xee,
                                            "static void TemplateCacheUnittest::TestExpandNoLoad()")
                              ;
                            }
                          }
                        }
                        else {
                          printf("ASSERT FAILED, line %d: %s\n",0xeb,"out == \"Hello, world\"");
                          bVar3 = std::operator==(&out,"Hello, world");
                          if (!bVar3) {
                            __assert_fail("out == \"Hello, world\"",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                          ,0xeb,
                                          "static void TemplateCacheUnittest::TestExpandNoLoad()");
                          }
                        }
                      }
                      else {
                        printf("ASSERT FAILED, line %d: %s\n",0xea,
                               "cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
                        local_178.ptr_ = top_filename._M_dataplus._M_p;
                        local_178.length_ = top_filename._M_string_length;
                        local_178.is_immutable_ = false;
                        local_178.id_ = 0;
                        bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                                          (&cache,&local_178,DO_NOT_STRIP,
                                           (TemplateDictionaryInterface *)&dict,(PerExpandData *)0x0
                                           ,&out);
                        if (!bVar3) {
                          __assert_fail("cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                        ,0xea,
                                        "static void TemplateCacheUnittest::TestExpandNoLoad()");
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            printf("ASSERT FAILED, line %d: %s\n",0xd6,"out == \"alone\"");
            bVar3 = std::operator==(&out,"alone");
            if (!bVar3) {
              __assert_fail("out == \"alone\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                            ,0xd6,"static void TemplateCacheUnittest::TestExpandNoLoad()");
            }
          }
        }
        else {
          printf("ASSERT FAILED, line %d: %s\n",0xd5,
                 "cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out)");
          local_178.ptr_ = filename._M_dataplus._M_p;
          local_178.length_ = filename._M_string_length;
          local_178.is_immutable_ = false;
          local_178.id_ = 0;
          bVar3 = ctemplate::TemplateCache::ExpandNoLoad
                            (&cache,&local_178,DO_NOT_STRIP,(TemplateDictionaryInterface *)&dict,
                             (PerExpandData *)0x0,&out);
          if (!bVar3) {
            __assert_fail("cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, __null, &out)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0xd5,"static void TemplateCacheUnittest::TestExpandNoLoad()");
          }
        }
      }
      else {
        printf("ASSERT FAILED, line %d: %s\n",0xd1,"out == \"alone\"");
        bVar3 = std::operator==(&out,"alone");
        if (!bVar3) {
          __assert_fail("out == \"alone\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0xd1,"static void TemplateCacheUnittest::TestExpandNoLoad()");
        }
      }
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0xd0,
             "cache.ExpandWithData(filename, DO_NOT_STRIP, &dict, NULL, &out)");
      local_178.ptr_ = filename._M_dataplus._M_p;
      local_178.length_ = filename._M_string_length;
      local_178.is_immutable_ = false;
      local_178.id_ = 0;
      bVar3 = ctemplate::TemplateCache::ExpandWithData
                        (&cache,&local_178,DO_NOT_STRIP,(TemplateDictionaryInterface *)&dict,
                         (PerExpandData *)0x0,&out);
      if (!bVar3) {
        __assert_fail("cache.ExpandWithData(filename, DO_NOT_STRIP, &dict, __null, &out)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0xd0,"static void TemplateCacheUnittest::TestExpandNoLoad()");
      }
    }
  }
  exit(1);
}

Assistant:

static void TestExpandNoLoad() {
    TemplateCache cache;
    string filename = StringToTemplateFile("alone");
    string top_filename = StringToTemplateFile("Hello, {{>WORLD}}");
    string inc_filename = StringToTemplateFile("world");

    TemplateDictionary dict("ExpandNoLoad");
    dict.AddIncludeDictionary("WORLD")->SetFilename(inc_filename);
    string out;

    // This should fail because the cache is empty.
    cache.Freeze();
    ASSERT(!cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out));

    cache.ClearCache();   // also clears the "frozen" state
    // This should succeed -- it loads inc_filename from disk.
    ASSERT(cache.ExpandWithData(filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "alone");
    out.clear();
    // Now this should succeed -- it's in the cache.
    cache.Freeze();
    ASSERT(cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "alone");
    out.clear();

    // This should fail because neither top nor inc are in the cache.
    cache.ClearCache();
    cache.Freeze();
    ASSERT(!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    cache.ClearCache();
    ASSERT(cache.LoadTemplate(top_filename, DO_NOT_STRIP));
    // This *should* fail, but because inc_filename isn't in the cache.
    cache.Freeze();
    ASSERT(!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    // TODO(csilvers): this should not be necessary.  But expand writes
    //                 to its output even before it fails.
    out.clear();
    cache.ClearCache();
    ASSERT(cache.LoadTemplate(top_filename, DO_NOT_STRIP));
    ASSERT(cache.LoadTemplate(inc_filename, DO_NOT_STRIP));
    cache.Freeze();
    // *Now* it should succeed, with everything it needs loaded.
    ASSERT(cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();
    // This should succeed too, of course.
    ASSERT(cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();

    cache.ClearCache();
    ASSERT(cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();
    // Now everything NoLoad needs should be in the cache again.
    cache.Freeze();
    ASSERT(cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();

    cache.ClearCache();
    ASSERT(cache.LoadTemplate(top_filename, DO_NOT_STRIP));
    cache.Freeze();
    // This fails, of course, because we're frozen.
    ASSERT(!cache.LoadTemplate(inc_filename, DO_NOT_STRIP));
    // And thus, this fails too.
    ASSERT(!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
  }